

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformtheme.cpp
# Opt level: O1

QVariant * QPlatformTheme::defaultThemeHint(QVariant *__return_storage_ptr__,ThemeHint hint)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  longlong lVar4;
  long in_FS_OFFSET;
  initializer_list<Qt::Key> args;
  bool ok;
  bool ok_1;
  ulong local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(hint) {
  case CursorFlashTime:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 1000;
LAB_00308fd8:
      ::QVariant::QVariant(__return_storage_ptr__,iVar1);
      return __return_storage_ptr__;
    }
    break;
  case KeyboardInputInterval:
  case MouseDoubleClickInterval:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 400;
      goto LAB_00308fd8;
    }
    break;
  case StartDragDistance:
  case MouseQuickSelectionThreshold:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 10;
      goto LAB_00308fd8;
    }
    break;
  case StartDragTime:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 500;
      goto LAB_00308fd8;
    }
    break;
  case KeyboardAutoRepeatRate:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 0x1e;
      goto LAB_00308fd8;
    }
    break;
  case PasswordMaskDelay:
  case StartDragVelocity:
  case ToolButtonStyle:
  case ToolBarIconSize:
  case DialogButtonBoxLayout:
  case KeyboardScheme:
  case UiEffects:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 0;
      goto LAB_00308fd8;
    }
    break;
  case TextCursorWidth:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 1;
      goto LAB_00308fd8;
    }
    break;
  case DropShadow:
  case ItemViewActivateItemOnSingleClick:
  case WindowAutoPlacement:
  case DialogButtonBoxButtonsHaveIcons:
  case UseFullScreenForPopupMenu:
  case DialogSnapToDefaultButton:
  case ContextMenuOnMouseRelease:
  case PreselectFirstFileInDirectory:
  case SetFocusOnTouchRelease:
  case MenuBarFocusOnAltPressRelease:
  case PreferFileIconFromTheme:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      bVar2 = false;
LAB_00308c5e:
      ::QVariant::QVariant(__return_storage_ptr__,bVar2);
      return __return_storage_ptr__;
    }
    break;
  case MaximumScrollBarDragDistance:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = -1;
      goto LAB_00308fd8;
    }
    break;
  case SystemIconThemeName:
  case SystemIconFallbackThemeName:
  case MouseCursorTheme:
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_48);
    if ((QArrayData *)local_48.shared == (QArrayData *)0x0) goto LAB_0030901f;
    LOCK();
    *(int *)local_48.shared = *(int *)local_48.shared + -1;
    UNLOCK();
    if (*(int *)local_48.shared != 0) goto LAB_0030901f;
    lVar4 = 2;
    goto LAB_00308f6e;
  case IconThemeSearchPaths:
  case StyleNames:
  case IconFallbackSearchPaths:
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    ::QVariant::QVariant(__return_storage_ptr__,(QList_conflict *)local_48.data);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_48);
    goto LAB_0030901f;
  case SpellCheckUnderlineStyle:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 6;
      goto LAB_00308fd8;
    }
    break;
  case TabFocusBehavior:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 0xff;
      goto LAB_00308fd8;
    }
    break;
  case IconPixmapSizes:
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    ::QVariant::fromValue<QList<int>,_true>(__return_storage_ptr__,(QList<int> *)&local_48);
    goto LAB_00308f4f;
  case PasswordMaskCharacter:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      ::QVariant::QVariant(__return_storage_ptr__,(QChar)0x25cf);
      return __return_storage_ptr__;
    }
    break;
  case MousePressAndHoldInterval:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 800;
      goto LAB_00308fd8;
    }
    break;
  case MouseDoubleClickDistance:
    local_48.shared = local_48.shared & 0xffffffffffffff00;
    iVar1 = qEnvironmentVariableIntValue("QT_DBL_CLICK_DIST",(bool *)local_48.data);
    iVar3 = 5;
    if (local_48.data[0] != '\0') {
      iVar3 = iVar1;
    }
    goto LAB_00309017;
  case WheelScrollLines:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 3;
      goto LAB_00308fd8;
    }
    break;
  case TouchDoubleTapDistance:
    local_50 = local_50 & 0xffffffffffffff00;
    iVar1 = qEnvironmentVariableIntValue("QT_DBL_TAP_DIST",(bool *)&local_50);
    if (local_50._0_1_ == false) {
      defaultThemeHint((QVariant *)&local_48,MouseDoubleClickDistance);
      iVar1 = ::QVariant::toInt((bool *)local_48.data);
      iVar1 = iVar1 * 2;
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    iVar3 = 10;
    if (local_50._0_1_ != false) {
      iVar3 = iVar1;
    }
LAB_00309017:
    ::QVariant::QVariant(__return_storage_ptr__,iVar3);
    goto LAB_0030901f;
  case ShowShortcutsInContextMenus:
  case InteractiveResizeAcrossScreens:
  case ShowDirectoriesFirst:
  case UnderlineShortcut:
  case ShowIconsInMenus:
  case MenuSelectionWraps:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      bVar2 = true;
      goto LAB_00308c5e;
    }
    break;
  case ButtonPressKeys:
    local_50 = 0x101000000000020;
    args._M_len = 2;
    args._M_array = (iterator)&local_50;
    QList<Qt::Key>::QList((QList<Qt::Key> *)&local_48,args);
    ::QVariant::fromValue<QList<Qt::Key>,_true>(__return_storage_ptr__,(QList<Qt::Key> *)&local_48);
LAB_00308f4f:
    if ((QArrayData *)local_48.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_48.shared = *(int *)local_48.shared + -1;
      UNLOCK();
      if (*(int *)local_48.shared == 0) {
        lVar4 = 4;
LAB_00308f6e:
        QArrayData::deallocate((QArrayData *)local_48.shared,lVar4,0x10);
      }
    }
    goto LAB_0030901f;
  case FlickStartDistance:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 0xf;
      goto LAB_00308fd8;
    }
    break;
  case FlickMaximumVelocity:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 0x9c4;
      goto LAB_00308fd8;
    }
    break;
  case FlickDeceleration:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar1 = 0x5dc;
      goto LAB_00308fd8;
    }
    break;
  case MouseCursorSize:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      ::QVariant::QVariant(__return_storage_ptr__,(QSize)0x1000000010);
      return __return_storage_ptr__;
    }
    break;
  default:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_0030901f:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QVariant QPlatformTheme::defaultThemeHint(ThemeHint hint)
{
    switch (hint) {
    case QPlatformTheme::CursorFlashTime:
        return QVariant(1000);
    case QPlatformTheme::KeyboardInputInterval:
        return QVariant(400);
    case QPlatformTheme::KeyboardAutoRepeatRate:
        return QVariant(30);
    case QPlatformTheme::MouseDoubleClickInterval:
        return QVariant(400);
    case QPlatformTheme::StartDragDistance:
        return QVariant(10);
    case QPlatformTheme::StartDragTime:
        return QVariant(500);
    case QPlatformTheme::PasswordMaskDelay:
        return QVariant(int(0));
    case QPlatformTheme::PasswordMaskCharacter:
        return QVariant(QChar(u'\x25CF'));
    case QPlatformTheme::StartDragVelocity:
        return QVariant(int(0)); // no limit
    case QPlatformTheme::UseFullScreenForPopupMenu:
        return QVariant(false);
    case QPlatformTheme::WindowAutoPlacement:
        return QVariant(false);
    case QPlatformTheme::DialogButtonBoxLayout:
        return QVariant(int(0));
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(false);
    case QPlatformTheme::ItemViewActivateItemOnSingleClick:
        return QVariant(false);
    case QPlatformTheme::ToolButtonStyle:
        return QVariant(int(Qt::ToolButtonIconOnly));
    case QPlatformTheme::ToolBarIconSize:
        return QVariant(int(0));
    case QPlatformTheme::SystemIconThemeName:
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QString());
    case QPlatformTheme::IconThemeSearchPaths:
        return QVariant(QStringList());
    case QPlatformTheme::IconFallbackSearchPaths:
        return QVariant(QStringList());
    case QPlatformTheme::StyleNames:
        return QVariant(QStringList());
    case QPlatformTheme::ShowShortcutsInContextMenus:
        return QVariant(true);
    case TextCursorWidth:
        return QVariant(1);
    case DropShadow:
        return QVariant(false);
    case MaximumScrollBarDragDistance:
        return QVariant(-1);
    case KeyboardScheme:
        return QVariant(int(WindowsKeyboardScheme));
    case UiEffects:
        return QVariant(int(0));
    case SpellCheckUnderlineStyle:
        return QVariant(int(QTextCharFormat::WaveUnderline));
    case TabFocusBehavior:
        return QVariant(int(Qt::TabFocusAllControls));
    case IconPixmapSizes:
        return QVariant::fromValue(QList<int>());
    case DialogSnapToDefaultButton:
    case ContextMenuOnMouseRelease:
        return QVariant(false);
    case MousePressAndHoldInterval:
        return QVariant(800);
    case MouseDoubleClickDistance:
        {
            bool ok = false;
            const int dist = qEnvironmentVariableIntValue("QT_DBL_CLICK_DIST", &ok);
            return QVariant(ok ? dist : 5);
        }
    case WheelScrollLines:
        return QVariant(3);
    case TouchDoubleTapDistance:
        {
            bool ok = false;
            int dist = qEnvironmentVariableIntValue("QT_DBL_TAP_DIST", &ok);
            if (!ok)
                dist = defaultThemeHint(MouseDoubleClickDistance).toInt(&ok) * 2;
            return QVariant(ok ? dist : 10);
        }
    case MouseQuickSelectionThreshold:
        return QVariant(10);
    case InteractiveResizeAcrossScreens:
        return true;
    case ShowDirectoriesFirst:
        return true;
    case PreselectFirstFileInDirectory:
        return false;
    case ButtonPressKeys:
        return QVariant::fromValue(QList<Qt::Key>({ Qt::Key_Space, Qt::Key_Select }));
    case SetFocusOnTouchRelease:
        return false;
    case FlickStartDistance:
        return QVariant(15);
    case FlickMaximumVelocity:
        return QVariant(2500);
    case FlickDeceleration:
        return QVariant(1500);
    case MenuBarFocusOnAltPressRelease:
        return false;
    case MouseCursorTheme:
        return QVariant(QString());
    case MouseCursorSize:
        return QVariant(QSize(16, 16));
    case UnderlineShortcut:
        return true;
    case ShowIconsInMenus:
        return true;
    case PreferFileIconFromTheme:
        return false;
    case MenuSelectionWraps:
        return true;
    }

    return QVariant();
}